

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteTranslational.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevoluteTranslational::Initialize
          (ChLinkRevoluteTranslational *this,shared_ptr<chrono::ChBody> *body1,
          shared_ptr<chrono::ChBody> *body2,ChCoordsys<double> *csys,double distance)

{
  ChQuaternion<double> *this_00;
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  ChBodyFrame *pCVar4;
  ChBodyFrame *pCVar5;
  ChVector<double> x_axis;
  ChVector<double> z_axis;
  ChVector<double> y_axis;
  ChVector<double> v;
  ChVector<double> local_b8;
  double local_98;
  ChVector<double> local_88;
  ChVector<double> local_68;
  ChVector<double> local_50;
  ChVector<double> local_38;
  
  peVar1 = (body1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar5 = &peVar1->super_ChBodyFrame;
  if (peVar1 == (element_type *)0x0) {
    pCVar5 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body1 = pCVar5;
  peVar1 = (body2->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pCVar4 = &peVar1->super_ChBodyFrame;
  if (peVar1 == (element_type *)0x0) {
    pCVar4 = (ChBodyFrame *)0x0;
  }
  (this->super_ChLink).Body2 = pCVar4;
  local_98 = distance;
  iVar2 = (*(pCVar5->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par1,(ChVariables *)CONCAT44(extraout_var,iVar2),
             (ChVariables *)CONCAT44(extraout_var_00,iVar3));
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_par2,(ChVariables *)CONCAT44(extraout_var_01,iVar2),
             (ChVariables *)CONCAT44(extraout_var_02,iVar3));
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dot,(ChVariables *)CONCAT44(extraout_var_03,iVar2),
             (ChVariables *)CONCAT44(extraout_var_04,iVar3));
  iVar2 = (*(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  iVar3 = (*(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
            _vptr_ChFrame[0x10])();
  ChConstraintTwoBodies::SetVariables
            (&this->m_cnstr_dist,(ChVariables *)CONCAT44(extraout_var_05,iVar2),
             (ChVariables *)CONCAT44(extraout_var_06,iVar3));
  this_00 = &csys->rot;
  ChQuaternion<double>::GetXaxis(this_00);
  ChQuaternion<double>::GetYaxis(this_00);
  ChQuaternion<double>::GetZaxis(this_00);
  ChFrame<double>::TransformPointParentToLocal
            (&local_b8,(ChFrame<double> *)(this->super_ChLink).Body1,&csys->pos);
  if (&local_b8 != &this->m_p1) {
    (this->m_p1).m_data[0] = local_b8.m_data[0];
    (this->m_p1).m_data[1] = local_b8.m_data[1];
    (this->m_p1).m_data[2] = local_b8.m_data[2];
  }
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_b8,(ChFrame<double> *)(this->super_ChLink).Body1,&local_68);
  if (&local_b8 != &this->m_z1) {
    (this->m_z1).m_data[0] = local_b8.m_data[0];
    (this->m_z1).m_data[1] = local_b8.m_data[1];
    (this->m_z1).m_data[2] = local_b8.m_data[2];
  }
  local_38.m_data[0] = local_98 * local_88.m_data[0] + (csys->pos).m_data[0];
  local_38.m_data[1] = local_98 * local_88.m_data[1] + (csys->pos).m_data[1];
  local_38.m_data[2] = local_98 * local_88.m_data[2] + (csys->pos).m_data[2];
  ChFrame<double>::TransformPointParentToLocal
            (&local_b8,(ChFrame<double> *)(this->super_ChLink).Body2,&local_38);
  if (&local_b8 != &this->m_p2) {
    (this->m_p2).m_data[0] = local_b8.m_data[0];
    (this->m_p2).m_data[1] = local_b8.m_data[1];
    (this->m_p2).m_data[2] = local_b8.m_data[2];
  }
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_b8,(ChFrame<double> *)(this->super_ChLink).Body2,&local_88);
  if (&local_b8 != &this->m_x2) {
    (this->m_x2).m_data[0] = local_b8.m_data[0];
    (this->m_x2).m_data[1] = local_b8.m_data[1];
    (this->m_x2).m_data[2] = local_b8.m_data[2];
  }
  ChFrame<double>::TransformDirectionParentToLocal
            (&local_b8,(ChFrame<double> *)(this->super_ChLink).Body2,&local_50);
  if (&local_b8 != &this->m_y2) {
    (this->m_y2).m_data[0] = local_b8.m_data[0];
    (this->m_y2).m_data[1] = local_b8.m_data[1];
    (this->m_y2).m_data[2] = local_b8.m_data[2];
  }
  this->m_dist = local_98;
  this->m_cur_dot = 0.0;
  this->m_cur_par1 = 0.0;
  this->m_cur_par2 = 0.0;
  this->m_cur_dist = local_98;
  return;
}

Assistant:

void ChLinkRevoluteTranslational::Initialize(std::shared_ptr<ChBody> body1,
                                             std::shared_ptr<ChBody> body2,
                                             const ChCoordsys<>& csys,
                                             double distance) {
    Body1 = body1.get();
    Body2 = body2.get();

    m_cnstr_par1.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_par2.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dot.SetVariables(&Body1->Variables(), &Body2->Variables());
    m_cnstr_dist.SetVariables(&Body1->Variables(), &Body2->Variables());

    ChVector<> x_axis = csys.rot.GetXaxis();
    ChVector<> y_axis = csys.rot.GetYaxis();
    ChVector<> z_axis = csys.rot.GetZaxis();

    m_p1 = Body1->TransformPointParentToLocal(csys.pos);
    m_z1 = Body1->TransformDirectionParentToLocal(z_axis);
    m_p2 = Body2->TransformPointParentToLocal(csys.pos + distance * x_axis);
    m_x2 = Body2->TransformDirectionParentToLocal(x_axis);
    m_y2 = Body2->TransformDirectionParentToLocal(y_axis);

    m_dist = distance;

    m_cur_par1 = 0;
    m_cur_par2 = 0;
    m_cur_dot = 0;
    m_cur_dist = distance;
}